

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O2

char * tinyfd_saveFileDialog
                 (char *aTitle,char *aDefaultPathAndFile,int aNumOfFilterPatterns,
                 char **aFilterPatterns,char *aSingleFilterDescription)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  FILE *__stream;
  char *pcVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  size_t sStack_850;
  char lDialogString [1024];
  char lString [1024];
  
  tinyfd_saveFileDialog::lBuff[0] = '\0';
  iVar2 = osascriptPresent();
  if (iVar2 != 0) {
    if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
      builtin_strncpy(tinyfd_response,"applescript",0xc);
      return (char *)0x1;
    }
    builtin_strncpy(lDialogString,"osascript ",0xb);
    iVar2 = osx9orBetter();
    if (iVar2 == 0) {
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4," -e \'tell application \"Finder\"\' -e \'Activate\'",
                      0x2e);
    }
    sVar4 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar4," -e \'try\' -e \'POSIX path of ( choose file name ",0x30)
    ;
    if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4,"with prompt \"",0xe);
      strcat(lDialogString,aTitle);
      sVar4 = strlen(lDialogString);
      (lDialogString + sVar4)[0] = '\"';
      (lDialogString + sVar4)[1] = ' ';
      lDialogString[sVar4 + 2] = '\0';
    }
    getPathWithoutFinalSlash(lString,aDefaultPathAndFile);
    if (lString[0] != '\0') {
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4,"default location \"",0x13);
      strcat(lDialogString,lString);
      sVar4 = strlen(lDialogString);
      (lDialogString + sVar4)[0] = '\"';
      (lDialogString + sVar4)[1] = ' ';
      lDialogString[sVar4 + 2] = '\0';
    }
    getLastName(lString,aDefaultPathAndFile);
    if (lString[0] != '\0') {
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4,"default name \"",0xf);
      strcat(lDialogString,lString);
      sVar4 = strlen(lDialogString);
      (lDialogString + sVar4)[0] = '\"';
      (lDialogString + sVar4)[1] = ' ';
      lDialogString[sVar4 + 2] = '\0';
    }
    sVar4 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar4,")\' ",4);
    sVar4 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar4,"-e \'on error number -128\' ",0x1b);
    sVar4 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar4,"-e \'end try\'",0xd);
    iVar2 = osx9orBetter();
    if (iVar2 == 0) {
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4," -e \'end tell\'",0xf);
    }
    goto LAB_00114075;
  }
  iVar2 = kdialogPresent();
  uVar7 = 0x676f6c6169646b;
  if (iVar2 != 0) {
    if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
LAB_001148af:
      tinyfd_response._0_4_ = (undefined4)uVar7;
      tinyfd_response._4_2_ = (undefined2)((ulong)uVar7 >> 0x20);
      tinyfd_response[6] = (char)((ulong)uVar7 >> 0x30);
      tinyfd_response._7_4_ = tinyfd_response._7_4_ & 0xffffff00;
      return (char *)0x1;
    }
    builtin_strncpy(lDialogString,"kdialog",8);
    iVar2 = kdialogPresent();
    if (iVar2 == 2) {
      sVar4 = strlen(lDialogString);
      memcpy(lDialogString + sVar4,
             " --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)",0x41);
    }
    sVar4 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar4," --getsavefilename ",0x14);
    if ((aDefaultPathAndFile == (char *)0x0) || (*aDefaultPathAndFile == '\0')) {
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4,"$PWD/",6);
    }
    else {
      if (*aDefaultPathAndFile != '/') {
        sVar4 = strlen(lDialogString);
        builtin_strncpy(lDialogString + sVar4,"$PWD/",6);
      }
      sVar4 = strlen(lDialogString);
      (lDialogString + sVar4)[0] = '\"';
      (lDialogString + sVar4)[1] = '\0';
      strcat(lDialogString,aDefaultPathAndFile);
      sVar4 = strlen(lDialogString);
      (lDialogString + sVar4)[0] = '\"';
      (lDialogString + sVar4)[1] = '\0';
    }
    if (0 < aNumOfFilterPatterns) {
      sVar4 = strlen(lDialogString);
      (lDialogString + sVar4)[0] = ' ';
      (lDialogString + sVar4)[1] = '\"';
      lDialogString[sVar4 + 2] = '\0';
      for (uVar6 = 0; (uint)aNumOfFilterPatterns != uVar6; uVar6 = uVar6 + 1) {
        strcat(lDialogString,aFilterPatterns[uVar6]);
        sVar4 = strlen(lDialogString);
        (lDialogString + sVar4)[0] = ' ';
        (lDialogString + sVar4)[1] = '\0';
      }
      if ((aSingleFilterDescription != (char *)0x0) && (*aSingleFilterDescription != '\0')) {
        sVar4 = strlen(lDialogString);
        builtin_strncpy(lDialogString + sVar4," | ",4);
        strcat(lDialogString,aSingleFilterDescription);
      }
      sVar4 = strlen(lDialogString);
      (lDialogString + sVar4)[0] = '\"';
      (lDialogString + sVar4)[1] = '\0';
    }
    if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4," --title \"",0xb);
      strcat(lDialogString,aTitle);
      sVar4 = strlen(lDialogString);
      (lDialogString + sVar4)[0] = '\"';
      (lDialogString + sVar4)[1] = '\0';
    }
    goto LAB_00114075;
  }
  iVar2 = zenityPresent();
  if ((iVar2 == 0) && (iVar2 = matedialogPresent(), iVar2 == 0)) {
    if (shellementaryPresent_lShellementaryPresent == '\0') {
      shellementaryPresent_lShellementaryPresent = '\x01';
    }
    iVar2 = qarmaPresent();
    if (iVar2 == 0) {
      iVar2 = xdialogPresent();
      if ((iVar2 == 0) && (iVar2 = tkinter2Present(), iVar2 != 0)) {
        if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
          uVar8._0_1_ = 'o';
          uVar8._1_1_ = 'n';
          uVar8._2_1_ = '2';
          uVar8._3_1_ = '-';
LAB_00114bde:
          tinyfd_response._4_2_ = (undefined2)uVar8;
          tinyfd_response[6] = SUB41(uVar8,2);
          builtin_strncpy(tinyfd_response + 8,"tkinter",8);
          tinyfd_response[7] = SUB41(uVar8,3);
          builtin_strncpy(tinyfd_response,"pyth",4);
          return (char *)0x1;
        }
        strcpy(lDialogString,gPython2Name);
        iVar2 = isTerminalRunning();
        if ((iVar2 == 0) && (iVar2 = isDarwin(), iVar2 != 0)) {
          sVar4 = strlen(lDialogString);
          builtin_strncpy(lDialogString + sVar4," -i",4);
        }
        sVar4 = strlen(lDialogString);
        memcpy(lDialogString + sVar4,
               " -S -c \"import Tkinter,tkFileDialog;root=Tkinter.Tk();root.withdraw();",0x47);
        iVar2 = isDarwin();
        if (iVar2 != 0) {
          sVar4 = strlen(lDialogString);
          memcpy(lDialogString + sVar4,
                 "import os;os.system(\'\'\'/usr/bin/osascript -e \'tell app \\\"Finder\\\" to set frontmost of process \\\"Python\\\" to true\' \'\'\');"
                 ,0x78);
        }
        sVar4 = strlen(lDialogString);
        builtin_strncpy(lDialogString + sVar4,"print tkFileDialog.asksaveasfilename(",0x26);
        if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
          sVar4 = strlen(lDialogString);
          builtin_strncpy(lDialogString + sVar4,"title=\'",8);
          strcat(lDialogString,aTitle);
          sVar4 = strlen(lDialogString);
          (lDialogString + sVar4)[0] = '\'';
          (lDialogString + sVar4)[1] = ',';
          lDialogString[sVar4 + 2] = '\0';
        }
        if ((aDefaultPathAndFile != (char *)0x0) && (*aDefaultPathAndFile != '\0')) {
          getPathWithoutFinalSlash(lString,aDefaultPathAndFile);
          if (lString[0] != '\0') {
            sVar4 = strlen(lDialogString);
            builtin_strncpy(lDialogString + sVar4,"initialdir=\'",0xd);
            strcat(lDialogString,lString);
            sVar4 = strlen(lDialogString);
            (lDialogString + sVar4)[0] = '\'';
            (lDialogString + sVar4)[1] = ',';
            lDialogString[sVar4 + 2] = '\0';
          }
          getLastName(lString,aDefaultPathAndFile);
          if (lString[0] != '\0') {
            sVar4 = strlen(lDialogString);
            builtin_strncpy(lDialogString + sVar4,"initialfile=\'",0xe);
            strcat(lDialogString,lString);
            sVar4 = strlen(lDialogString);
            (lDialogString + sVar4)[0] = '\'';
            (lDialogString + sVar4)[1] = ',';
            lDialogString[sVar4 + 2] = '\0';
          }
        }
        if ((1 < aNumOfFilterPatterns) ||
           ((aNumOfFilterPatterns == 1 &&
            (pcVar5 = *aFilterPatterns, sVar4 = strlen(pcVar5), pcVar5[sVar4 - 1] != '*')))) {
          sVar4 = strlen(lDialogString);
          builtin_strncpy(lDialogString + sVar4,"filetypes=(",0xc);
          sVar4 = strlen(lDialogString);
          (lDialogString + sVar4)[0] = '(';
          (lDialogString + sVar4)[1] = '\'';
          lDialogString[sVar4 + 2] = '\0';
          if ((aSingleFilterDescription != (char *)0x0) && (*aSingleFilterDescription != '\0')) {
            strcat(lDialogString,aSingleFilterDescription);
          }
          sVar4 = strlen(lDialogString);
          builtin_strncpy(lDialogString + sVar4,"\',(",4);
          for (uVar6 = 0; sVar4 = strlen(lDialogString), (uint)aNumOfFilterPatterns != uVar6;
              uVar6 = uVar6 + 1) {
            (lDialogString + sVar4)[0] = '\'';
            (lDialogString + sVar4)[1] = '\0';
            strcat(lDialogString,aFilterPatterns[uVar6]);
            sVar4 = strlen(lDialogString);
            (lDialogString + sVar4)[0] = '\'';
            (lDialogString + sVar4)[1] = ',';
            lDialogString[sVar4 + 2] = '\0';
          }
          builtin_strncpy(lDialogString + sVar4,")),",4);
          sVar4 = strlen(lDialogString);
          builtin_strncpy(lDialogString + sVar4,"(\'All files\',\'*\'))",0x13);
        }
        sVar4 = strlen(lDialogString);
        (lDialogString + sVar4)[0] = ')';
        (lDialogString + sVar4)[1] = '\"';
        lDialogString[sVar4 + 2] = '\0';
        goto LAB_00114075;
      }
      iVar2 = xdialogPresent();
      if ((iVar2 == 0) && (iVar2 = tkinter3Present(), iVar2 != 0)) {
        if (aTitle == (char *)0x0) {
          strcpy(lDialogString,gPython3Name);
          sVar4 = strlen(lDialogString);
          memcpy(lDialogString + sVar4,
                 " -S -c \"import tkinter;from tkinter import filedialog;root=tkinter.Tk();root.withdraw();"
                 ,0x59);
          sVar4 = strlen(lDialogString);
          builtin_strncpy(lDialogString + sVar4,"print( filedialog.asksaveasfilename(",0x25);
        }
        else {
          iVar2 = strcmp(aTitle,"tinyfd_query");
          if (iVar2 == 0) {
            uVar8._0_1_ = 'o';
            uVar8._1_1_ = 'n';
            uVar8._2_1_ = '3';
            uVar8._3_1_ = '-';
            goto LAB_00114bde;
          }
          strcpy(lDialogString,gPython3Name);
          sVar4 = strlen(lDialogString);
          memcpy(lDialogString + sVar4,
                 " -S -c \"import tkinter;from tkinter import filedialog;root=tkinter.Tk();root.withdraw();"
                 ,0x59);
          sVar4 = strlen(lDialogString);
          builtin_strncpy(lDialogString + sVar4,"print( filedialog.asksaveasfilename(",0x25);
          if (*aTitle != '\0') {
            sVar4 = strlen(lDialogString);
            builtin_strncpy(lDialogString + sVar4,"title=\'",8);
            strcat(lDialogString,aTitle);
            sVar4 = strlen(lDialogString);
            (lDialogString + sVar4)[0] = '\'';
            (lDialogString + sVar4)[1] = ',';
            lDialogString[sVar4 + 2] = '\0';
          }
        }
        if ((aDefaultPathAndFile != (char *)0x0) && (*aDefaultPathAndFile != '\0')) {
          getPathWithoutFinalSlash(lString,aDefaultPathAndFile);
          if (lString[0] != '\0') {
            sVar4 = strlen(lDialogString);
            builtin_strncpy(lDialogString + sVar4,"initialdir=\'",0xd);
            strcat(lDialogString,lString);
            sVar4 = strlen(lDialogString);
            (lDialogString + sVar4)[0] = '\'';
            (lDialogString + sVar4)[1] = ',';
            lDialogString[sVar4 + 2] = '\0';
          }
          getLastName(lString,aDefaultPathAndFile);
          if (lString[0] != '\0') {
            sVar4 = strlen(lDialogString);
            builtin_strncpy(lDialogString + sVar4,"initialfile=\'",0xe);
            strcat(lDialogString,lString);
            sVar4 = strlen(lDialogString);
            (lDialogString + sVar4)[0] = '\'';
            (lDialogString + sVar4)[1] = ',';
            lDialogString[sVar4 + 2] = '\0';
          }
        }
        if ((1 < aNumOfFilterPatterns) ||
           ((aNumOfFilterPatterns == 1 &&
            (pcVar5 = *aFilterPatterns, sVar4 = strlen(pcVar5), pcVar5[sVar4 - 1] != '*')))) {
          sVar4 = strlen(lDialogString);
          builtin_strncpy(lDialogString + sVar4,"filetypes=(",0xc);
          sVar4 = strlen(lDialogString);
          (lDialogString + sVar4)[0] = '(';
          (lDialogString + sVar4)[1] = '\'';
          lDialogString[sVar4 + 2] = '\0';
          if ((aSingleFilterDescription != (char *)0x0) && (*aSingleFilterDescription != '\0')) {
            strcat(lDialogString,aSingleFilterDescription);
          }
          sVar4 = strlen(lDialogString);
          builtin_strncpy(lDialogString + sVar4,"\',(",4);
          for (uVar6 = 0; sVar4 = strlen(lDialogString), (uint)aNumOfFilterPatterns != uVar6;
              uVar6 = uVar6 + 1) {
            (lDialogString + sVar4)[0] = '\'';
            (lDialogString + sVar4)[1] = '\0';
            strcat(lDialogString,aFilterPatterns[uVar6]);
            sVar4 = strlen(lDialogString);
            (lDialogString + sVar4)[0] = '\'';
            (lDialogString + sVar4)[1] = ',';
            lDialogString[sVar4 + 2] = '\0';
          }
          builtin_strncpy(lDialogString + sVar4,")),",4);
          sVar4 = strlen(lDialogString);
          builtin_strncpy(lDialogString + sVar4,"(\'All files\',\'*\'))",0x13);
        }
        sVar4 = strlen(lDialogString);
        builtin_strncpy(lDialogString + sVar4,"))\"",4);
        goto LAB_00114075;
      }
      iVar2 = xdialogPresent();
      if ((iVar2 == 0) && (pcVar5 = dialogName(), pcVar5 == (char *)0x0)) {
        if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
          pcVar5 = tinyfd_inputBox(aTitle,(char *)0x0,(char *)0x0);
          return pcVar5;
        }
        pcVar5 = tinyfd_inputBox(aTitle,"Save file","");
        getPathWithoutFinalSlash(lString,pcVar5);
        if ((lString[0] != '\0') && (iVar2 = dirExists(lString), iVar2 == 0)) {
          return (char *)0x0;
        }
        getLastName(lString,pcVar5);
        if (lString[0] == '\0') {
          return (char *)0x0;
        }
        return pcVar5;
      }
      iVar2 = xdialogPresent();
      if (iVar2 == 0) {
        iVar3 = isTerminalRunning();
        if (iVar3 != 0) {
          if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
            builtin_strncpy(tinyfd_response,"dialog",7);
            return (char *)0x0;
          }
          builtin_strncpy(lDialogString,"(dialog ",9);
          goto LAB_001145dd;
        }
        if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
          builtin_strncpy(tinyfd_response,"dialog",7);
          return (char *)0x0;
        }
        pcVar5 = terminalName();
        strcpy(lDialogString,pcVar5);
        sVar4 = strlen(lDialogString);
        (lDialogString + sVar4)[0] = '\'';
        (lDialogString + sVar4)[1] = '(';
        lDialogString[sVar4 + 2] = '\0';
        pcVar5 = dialogName();
        strcat(lDialogString,pcVar5);
        sVar4 = strlen(lDialogString);
        (lDialogString + sVar4)[0] = ' ';
        (lDialogString + sVar4)[1] = '\0';
        bVar1 = false;
      }
      else {
        if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
          uVar7 = 0x676f6c61696478;
          goto LAB_001148af;
        }
        builtin_strncpy(lDialogString,"(Xdialog ",10);
LAB_001145dd:
        bVar1 = true;
      }
      if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
        sVar4 = strlen(lDialogString);
        builtin_strncpy(lDialogString + sVar4,"--title \"",10);
        strcat(lDialogString,aTitle);
        sVar4 = strlen(lDialogString);
        (lDialogString + sVar4)[0] = '\"';
        (lDialogString + sVar4)[1] = ' ';
        lDialogString[sVar4 + 2] = '\0';
      }
      iVar3 = xdialogPresent();
      if ((iVar3 == 0) && (iVar3 = gdialogPresent(), iVar3 == 0)) {
        sVar4 = strlen(lDialogString);
        builtin_strncpy(lDialogString + sVar4,"--backtitle \"",0xe);
        sVar4 = strlen(lDialogString);
        memcpy(lDialogString + sVar4,
               "tab: focus | /: populate | spacebar: fill text field | ok: TEXT FIELD ONLY",0x4b);
        sVar4 = strlen(lDialogString);
        (lDialogString + sVar4)[0] = '\"';
        (lDialogString + sVar4)[1] = ' ';
        lDialogString[sVar4 + 2] = '\0';
      }
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4,"--fselect \"",0xc);
      if ((aDefaultPathAndFile == (char *)0x0) || (*aDefaultPathAndFile == '\0')) {
        iVar3 = isTerminalRunning();
        if (iVar3 == 0 && iVar2 == 0) {
          pcVar5 = getenv("HOME");
          strcat(lDialogString,pcVar5);
          sVar4 = strlen(lDialogString);
          (lDialogString + sVar4)[0] = '/';
          (lDialogString + sVar4)[1] = '\0';
        }
        else {
          sVar4 = strlen(lDialogString);
          (lDialogString + sVar4)[0] = '.';
          (lDialogString + sVar4)[1] = '/';
          lDialogString[sVar4 + 2] = '\0';
        }
      }
      else {
        pcVar5 = strchr(aDefaultPathAndFile,0x2f);
        if (pcVar5 == (char *)0x0) {
          sVar4 = strlen(lDialogString);
          (lDialogString + sVar4)[0] = '.';
          (lDialogString + sVar4)[1] = '/';
          lDialogString[sVar4 + 2] = '\0';
        }
        strcat(lDialogString,aDefaultPathAndFile);
      }
      sVar4 = strlen(lDialogString);
      if (iVar2 == 0) {
        builtin_strncpy(lDialogString + sVar4,"\" 0 60  >/dev/tty) ",0x14);
        sVar4 = strlen(lDialogString);
        if (bVar1) {
          builtin_strncpy(lDialogString + sVar4,"2>&1 ; clear >/dev/tty",0x17);
        }
        else {
          builtin_strncpy(lDialogString + sVar4,
                          "2>/tmp/tinyfd.txt\';cat /tmp/tinyfd.txt;rm /tmp/tinyfd.txt",0x3a);
        }
      }
      else {
        builtin_strncpy(lDialogString + sVar4,"\" 0 60 ) 2>&1 ",0xf);
      }
      goto LAB_00114075;
    }
  }
  iVar2 = zenityPresent();
  if (iVar2 == 0) {
    iVar2 = matedialogPresent();
    if (iVar2 == 0) {
      if (shellementaryPresent_lShellementaryPresent == '\0') {
        shellementaryPresent_lShellementaryPresent = '\x01';
      }
      if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
        builtin_strncpy(tinyfd_response,"qarma",6);
        return (char *)0x1;
      }
      builtin_strncpy(lDialogString,"qarma",6);
      pcVar5 = getenv("SSH_TTY");
      if (pcVar5 == (char *)0x0) {
        sVar4 = strlen(lDialogString);
        pcVar5 = " --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)";
        sStack_850 = 0x41;
        goto LAB_00113ed6;
      }
    }
    else {
      if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
        builtin_strncpy(tinyfd_response,"matedialog",0xb);
        return (char *)0x1;
      }
      builtin_strncpy(lDialogString,"matedialog",0xb);
    }
  }
  else {
    if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
      builtin_strncpy(tinyfd_response,"zenity",7);
      return (char *)0x1;
    }
    builtin_strncpy(lDialogString,"zenity",7);
    iVar2 = zenity3Present();
    if ((3 < iVar2) && (pcVar5 = getenv("SSH_TTY"), pcVar5 == (char *)0x0)) {
      sVar4 = strlen(lDialogString);
      pcVar5 = " --attach=$(sleep .01;xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)";
      sStack_850 = 0x4b;
LAB_00113ed6:
      memcpy(lDialogString + sVar4,pcVar5,sStack_850);
    }
  }
  sVar4 = strlen(lDialogString);
  builtin_strncpy(lDialogString + sVar4," --file-selection --save --confirm-overwrite",0x2d);
  if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
    sVar4 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar4," --title=\"",0xb);
    strcat(lDialogString,aTitle);
    sVar4 = strlen(lDialogString);
    (lDialogString + sVar4)[0] = '\"';
    (lDialogString + sVar4)[1] = '\0';
  }
  if ((aDefaultPathAndFile != (char *)0x0) && (*aDefaultPathAndFile != '\0')) {
    sVar4 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar4," --filename=\"",0xe);
    strcat(lDialogString,aDefaultPathAndFile);
    sVar4 = strlen(lDialogString);
    (lDialogString + sVar4)[0] = '\"';
    (lDialogString + sVar4)[1] = '\0';
  }
  if (0 < aNumOfFilterPatterns) {
    sVar4 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar4," --file-filter=\'",0x11);
    if ((aSingleFilterDescription != (char *)0x0) && (*aSingleFilterDescription != '\0')) {
      strcat(lDialogString,aSingleFilterDescription);
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4," | ",4);
    }
    for (uVar6 = 0; (uint)aNumOfFilterPatterns != uVar6; uVar6 = uVar6 + 1) {
      strcat(lDialogString,aFilterPatterns[uVar6]);
      sVar4 = strlen(lDialogString);
      (lDialogString + sVar4)[0] = ' ';
      (lDialogString + sVar4)[1] = '\0';
    }
    sVar4 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar4,"\' --file-filter=\'All files | *\'",0x20);
  }
  if (tinyfd_silent != 0) {
    sVar4 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar4," 2>/dev/null ",0xe);
  }
LAB_00114075:
  if (tinyfd_verbose != 0) {
    printf("lDialogString: %s\n",lDialogString);
  }
  __stream = popen(lDialogString,"r");
  if (__stream != (FILE *)0x0) {
    do {
      pcVar5 = fgets(tinyfd_saveFileDialog::lBuff,0x400,__stream);
    } while (pcVar5 != (char *)0x0);
    pclose(__stream);
    sVar4 = strlen(tinyfd_saveFileDialog::lBuff);
    if (tinyfd_inputBox::lBuff[sVar4 + 0x3ff] == '\n') {
      tinyfd_inputBox::lBuff[sVar4 + 0x3ff] = '\0';
    }
    if ((tinyfd_saveFileDialog::lBuff[0] != '\0') &&
       ((getPathWithoutFinalSlash(lString,tinyfd_saveFileDialog::lBuff), lString[0] == '\0' ||
        (iVar2 = dirExists(lString), iVar2 != 0)))) {
      getLastName(lString,tinyfd_saveFileDialog::lBuff);
      if ((lString[0] != '\0') && (pcVar5 = strpbrk(lString,"\\/:*?\"<>|"), pcVar5 == (char *)0x0))
      {
        return tinyfd_saveFileDialog::lBuff;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char const * tinyfd_saveFileDialog(
        char const * const aTitle , /* NULL or "" */
        char const * const aDefaultPathAndFile , /* NULL or "" */
        int const aNumOfFilterPatterns , /* 0 */
        char const * const * const aFilterPatterns , /* NULL or {"*.jpg","*.png"} */
        char const * const aSingleFilterDescription ) /* NULL or "image files" */
{
        static char lBuff [MAX_PATH_OR_CMD] ;
        char lString[MAX_PATH_OR_CMD] ;
        char const * p ;
        lBuff[0]='\0';
#ifndef TINYFD_NOLIB
        if ( ( !tinyfd_forceConsole || !( GetConsoleWindow() || dialogPresent() ) )
          && ( !getenv("SSH_CLIENT") || getenv("DISPLAY") ) )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"windows");return (char const *)1;}
                if (tinyfd_winUtf8)
                {
                        p = saveFileDialogWinGui8(lBuff,
                                aTitle, aDefaultPathAndFile, aNumOfFilterPatterns, aFilterPatterns, aSingleFilterDescription);
                }
                else
                {
                        p = saveFileDialogWinGuiA(lBuff,
                                aTitle, aDefaultPathAndFile, aNumOfFilterPatterns, aFilterPatterns, aSingleFilterDescription);
                }
        }
        else
#endif /* TINYFD_NOLIB */
        if ( dialogPresent() )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"dialog");return (char const *)0;}
                p = saveFileDialogWinConsole(lBuff,aTitle,aDefaultPathAndFile);
        }
        else
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"basicinput");return (char const *)0;}
                p = tinyfd_inputBox(aTitle, "Save file","");
        }

        if ( ! p || ! strlen( p )  )
        {
                return NULL;
        }
        getPathWithoutFinalSlash( lString , p ) ;
        if ( strlen( lString ) && ! dirExists( lString ) )
        {
                return NULL ;
        }
        getLastName(lString,p);
        if ( ! filenameValid(lString) )
        {
                return NULL;
        }
        return p ;
}